

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O1

void dirIfInternal(char *dirName,aint val)

{
  uint uVar1;
  bool bVar2;
  EReturn EVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  char errorsTxt [2] [48];
  uint local_9c;
  char local_98 [48];
  char local_68 [56];
  
  lVar6 = 0;
  local_9c = val;
  do {
    snprintf(local_98 + lVar6,0x30,dirIfErrorsTxtSrc[0] + lVar6,dirName);
    lVar6 = lVar6 + 0x30;
  } while (lVar6 == 0x30);
  uVar4 = 0;
  ListFile(false);
  iVar5 = 0;
  do {
    uVar1 = local_9c;
    if (local_9c == 0) {
      EVar3 = SkipFile();
    }
    else {
      EVar3 = ReadFile();
    }
    uVar4 = uVar1 | uVar4;
    if (EVar3 == ELSEIF) {
      bVar2 = local_9c == 0;
      local_9c = (uint)(bVar2 && uVar4 == 0);
      if ((bVar2 && uVar4 == 0) && (bVar2 = dirIfIfn((aint *)&local_9c), !bVar2)) {
        local_9c = 0;
        uVar4 = 1;
      }
    }
    else if (EVar3 != ENDIF) {
      if (EVar3 != ELSE) {
        if (IsRunning != 0) {
          Error(local_98,(char *)0x0,PASS3);
        }
        donotlist = (uint)(IsRunning == 0);
        return;
      }
      if (iVar5 != 0) {
        Error(local_68,(char *)0x0,PASS3);
      }
      iVar5 = iVar5 + 1;
      local_9c = (uint)(local_9c == 0 && uVar4 == 0);
    }
  } while (EVar3 != ENDIF);
  return;
}

Assistant:

static void dirIfInternal(const char* dirName, aint val) {
	// set up error messages for the particular pseudo-op
	char errorsTxt[dirIfErrorsN][dirIfErrorsSZ];
	for (size_t i = 0; i < dirIfErrorsN; ++i) {
		SPRINTF1(errorsTxt[i], dirIfErrorsSZ, dirIfErrorsTxtSrc[i], dirName);
	}
	// do the IF**some** part
	ListFile();
	EReturn ret = END;
	aint elseCounter = 0;
	aint orVal = false;
	while (ENDIF != ret) {
		orVal |= val;
		switch (ret = val ? ReadFile() : SkipFile()) {
			case ELSE:
				if (elseCounter++) Error(errorsTxt[1]);
				val = !val && !orVal;
				break;
			case ELSEIF:
				val = !val && !orVal;
				if (val) {		// active ELSEIF, evaluate expression
					if (!dirIfIfn(val)) {
						val = false;		// syntax error in expression
						orVal = true;		// force remaining IF-blocks inactive
					}
				}
				break;
			case ENDIF:
				break;
			default:
				if (IsRunning) Error(errorsTxt[0]);
				donotlist=!IsRunning;		// do the listing only if still running
				return;
		}
	}
}